

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  char *pcVar1;
  char local_148 [8];
  char zBuf [200];
  undefined1 local_78 [8];
  StrAccum acc;
  int iStack_50;
  char cSep;
  int j;
  int i;
  int rc;
  PragmaVtab *pTab;
  PragmaName *pPragma;
  char **pzErr_local;
  sqlite3_vtab **ppVtab_local;
  char **argv_local;
  int argc_local;
  void *pAux_local;
  sqlite3 *db_local;
  
  _i = (sqlite3_vtab *)0x0;
  acc.nChar._3_1_ = '(';
  sqlite3StrAccumInit((StrAccum *)local_78,(sqlite3 *)0x0,local_148,200,0);
  sqlite3_str_appendall((sqlite3_str *)local_78,"CREATE TABLE x");
  iStack_50 = 0;
  acc._28_4_ = ZEXT14(*(byte *)((long)pAux + 10));
  for (; iStack_50 < (int)(uint)*(byte *)((long)pAux + 0xb); iStack_50 = iStack_50 + 1) {
    sqlite3_str_appendf((StrAccum *)local_78,"%c\"%s\"",(ulong)(uint)(int)acc.nChar._3_1_,
                        pragCName[(int)acc._28_4_]);
    acc.nChar._3_1_ = ',';
    acc._28_4_ = acc._28_4_ + 1;
  }
  if (iStack_50 == 0) {
    sqlite3_str_appendf((StrAccum *)local_78,"(\"%s\"",*pAux);
    iStack_50 = 1;
  }
  acc.accError = '\0';
  acc.printfFlags = '\0';
  acc._30_2_ = 0;
  if ((*(byte *)((long)pAux + 9) & 0x20) != 0) {
    sqlite3_str_appendall((sqlite3_str *)local_78,",arg HIDDEN");
    acc._28_4_ = acc._28_4_ + 1;
  }
  if ((*(byte *)((long)pAux + 9) & 0xc0) != 0) {
    sqlite3_str_appendall((sqlite3_str *)local_78,",schema HIDDEN");
    acc._28_4_ = acc._28_4_ + 1;
  }
  sqlite3_str_append((sqlite3_str *)local_78,")",1);
  sqlite3StrAccumFinish((StrAccum *)local_78);
  j = sqlite3_declare_vtab(db,local_148);
  if (j == 0) {
    _i = (sqlite3_vtab *)sqlite3_malloc(0x30);
    if (_i == (sqlite3_vtab *)0x0) {
      j = 7;
    }
    else {
      memset(_i,0,0x30);
      *(void **)&_i[1].nRef = pAux;
      _i[1].pModule = (sqlite3_module *)db;
      *(char *)((long)&_i[1].zErrMsg + 1) = (char)iStack_50;
      *(u8 *)&_i[1].zErrMsg = acc.accError;
    }
  }
  else {
    pcVar1 = sqlite3_errmsg(db);
    pcVar1 = sqlite3_mprintf("%s",pcVar1);
    *pzErr = pcVar1;
  }
  *ppVtab = _i;
  return j;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}